

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O2

bool HDFHDD::IsRecognised(string *path)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  bool bVar3;
  RS_IDE sHeader;
  
  sHeader.szSignature[0] = '\0';
  sHeader.szSignature[1] = '\0';
  sHeader.szSignature[2] = '\0';
  sHeader.szSignature[3] = '\0';
  sHeader.szSignature[4] = '\0';
  sHeader.szSignature[5] = '\0';
  sHeader.bEOF = '\0';
  sHeader.bRevision = '\0';
  sHeader.bFlags = '\0';
  sHeader.bOffsetLow = '\0';
  sHeader.bOffsetHigh = '\0';
  sHeader.abReserved[0] = '\0';
  sHeader.abReserved[1] = '\0';
  sHeader.abReserved[2] = '\0';
  sHeader.abReserved[3] = '\0';
  sHeader.abReserved[4] = '\0';
  sHeader.abReserved[5] = '\0';
  sHeader.abReserved[6] = '\0';
  sHeader.abReserved[7] = '\0';
  sHeader.abReserved[8] = '\0';
  sHeader.abReserved[9] = '\0';
  sHeader.abReserved[10] = '\0';
  __fd = open64((path->_M_dataplus)._M_p,2);
  if ((__fd == -1) && (__fd = open64((path->_M_dataplus)._M_p,0), __fd == -1)) {
    return false;
  }
  sVar2 = read(__fd,&sHeader,0x16);
  if (sVar2 == 0x16) {
    iVar1 = bcmp(&sHeader,"RS-IDE",6);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  close(__fd);
  return bVar3;
}

Assistant:

bool HDFHDD::IsRecognised(const std::string& path)
{
    int h = -1;
    RS_IDE sHeader = {};

    // Open as read-write, falling back on read-only
    if ((h = open(path.c_str(), O_RDWR | O_BINARY)) == -1 &&
        (h = open(path.c_str(), O_RDONLY | O_BINARY)) == -1)
        return false;

    // Read the file header and check the signature string
    if (read(h, &sHeader, sizeof(sHeader)) != sizeof(sHeader) ||
        memcmp(sHeader.szSignature, "RS-IDE", sizeof(sHeader.szSignature)))
    {
        close(h);
        return false;
    }

    // Appears valid
    close(h);
    return true;
}